

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

pair<unsigned_int,_const_dg::vr::AllocatedArea_*> __thiscall
dg::vr::StructureAnalyzer::getEqualArea(StructureAnalyzer *this,ValueRelations *graph,Value *ptr)

{
  uint uVar1;
  pointer ppVVar3;
  pair<unsigned_int,_const_dg::vr::AllocatedArea_*> pVar4;
  _Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> local_40;
  AllocatedArea *pAVar2;
  
  ValueRelations::getEqual((VectorSet<const_llvm::Value_*> *)&local_40,graph,ptr);
  ppVVar3 = local_40._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVVar3 == local_40._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
                (&local_40);
      uVar1 = 0;
      pAVar2 = (AllocatedArea *)0x0;
      goto LAB_0013ba12;
    }
    pVar4 = getAllocatedAreaFor(this,*ppVVar3);
    pAVar2 = pVar4.second;
    ppVVar3 = ppVVar3 + 1;
  } while (pAVar2 == (AllocatedArea *)0x0);
  uVar1 = pVar4.first;
  std::_Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::~_Vector_base
            (&local_40);
LAB_0013ba12:
  pVar4._4_4_ = 0;
  pVar4.first = uVar1;
  pVar4.second = pAVar2;
  return pVar4;
}

Assistant:

std::pair<unsigned, const AllocatedArea *>
StructureAnalyzer::getEqualArea(const ValueRelations &graph,
                                const llvm::Value *ptr) const {
    unsigned index = 0;
    const AllocatedArea *area = nullptr;
    for (const auto *equal : graph.getEqual(ptr)) {
        std::tie(index, area) = getAllocatedAreaFor(equal);
        if (area)
            return {index, area};
    }
    return {0, nullptr};
}